

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O3

Frag __thiscall re2::Compiler::Capture(Compiler *this,Frag a,int n)

{
  Inst *pIVar1;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  uint uVar5;
  ulong uVar6;
  
  if (a.begin != 0) {
    uVar3 = AllocInst(this,2);
    if (-1 < (int)uVar3) {
      uVar6 = (ulong)a >> 0x20;
      uVar4 = (ulong)uVar3;
      Prog::Inst::InitCapture
                ((this->inst_).ptr_._M_t.
                 super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                 _M_t.
                 super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                 super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl + uVar4,n * 2,a.begin)
      ;
      uVar3 = uVar3 + 1;
      Prog::Inst::InitCapture
                ((this->inst_).ptr_._M_t.
                 super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                 _M_t.
                 super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                 super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl + uVar4 + 1,n * 2 + 1,
                 0);
      if (uVar6 != 0) {
        pIVar1 = (this->inst_).ptr_._M_t.
                 super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                 _M_t.
                 super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                 super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
        do {
          uVar2 = uVar6 >> 1;
          if ((uVar6 & 1) == 0) {
            uVar5 = pIVar1[uVar2].out_opcode_ >> 4;
            pIVar1[uVar2].out_opcode_ = pIVar1[uVar2].out_opcode_ & 0xf | uVar3 * 0x10;
          }
          else {
            uVar5 = pIVar1[uVar2].field_1.out1_;
            pIVar1[uVar2].field_1.out1_ = uVar3;
          }
          uVar6 = (ulong)uVar5;
        } while (uVar5 != 0);
      }
      uVar6 = (ulong)uVar3 << 0x21;
      goto LAB_001c2db7;
    }
  }
  uVar6 = 0;
  uVar4 = 0;
LAB_001c2db7:
  return (Frag)(uVar6 | uVar4);
}

Assistant:

Frag Compiler::Capture(Frag a, int n) {
  if (IsNoMatch(a))
    return NoMatch();
  int id = AllocInst(2);
  if (id < 0)
    return NoMatch();
  inst_[id].InitCapture(2*n, a.begin);
  inst_[id+1].InitCapture(2*n+1, 0);
  PatchList::Patch(inst_.data(), a.end, id+1);

  return Frag(id, PatchList::Mk((id+1) << 1));
}